

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-caster.h
# Opt level: O1

int dynamicgraph::signal_io_base<int>::cast(istringstream *is)

{
  ExceptionSignal *this;
  int inst;
  ErrorCodeEnum local_60;
  int local_5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::istream::operator>>((istream *)is,&local_5c);
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) == 0) {
    return local_5c;
  }
  this = (ExceptionSignal *)__cxa_allocate_exception(0x30);
  local_60 = GENERIC;
  std::__cxx11::stringbuf::str();
  std::operator+(&local_38,"failed to serialize ",&local_58);
  dynamicgraph::ExceptionSignal::ExceptionSignal(this,&local_60,(string *)&local_38);
  __cxa_throw(this,&ExceptionSignal::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

inline static T cast(std::istringstream &is) {
    T inst;
    is >> inst;
    if (is.fail()) {
      throw ExceptionSignal(ExceptionSignal::GENERIC,
                            "failed to serialize " + is.str());
    }
    return inst;
  }